

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5StructureRelease(Fts5Structure *pStruct)

{
  int iVar1;
  int local_14;
  int i;
  Fts5Structure *pStruct_local;
  
  if ((pStruct != (Fts5Structure *)0x0) &&
     (iVar1 = pStruct->nRef + -1, pStruct->nRef = iVar1, iVar1 < 1)) {
    for (local_14 = 0; local_14 < pStruct->nLevel; local_14 = local_14 + 1) {
      sqlite3_free(pStruct->aLevel[local_14].aSeg);
    }
    sqlite3_free(pStruct);
  }
  return;
}

Assistant:

static void fts5StructureRelease(Fts5Structure *pStruct){
  if( pStruct && 0>=(--pStruct->nRef) ){
    int i;
    assert( pStruct->nRef==0 );
    for(i=0; i<pStruct->nLevel; i++){
      sqlite3_free(pStruct->aLevel[i].aSeg);
    }
    sqlite3_free(pStruct);
  }
}